

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O0

char * zt_opt_verror_str(int code,char *fmt,__va_list_tag *ap)

{
  __gnuc_va_list in_RDX;
  char *in_RSI;
  uint in_EDI;
  int len;
  char *final;
  char *user_message;
  char *msg;
  char *local_40;
  char *local_30;
  char *local_28;
  char *local_20;
  __gnuc_va_list local_18;
  char *local_10;
  
  local_20 = (char *)0x0;
  local_28 = (char *)0x0;
  local_30 = (char *)0x0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_EDI == 0) {
    local_40 = "";
  }
  else {
    local_40 = strerror(in_EDI);
  }
  asprintf(&local_20,"error: { code: %d, string: \"%s",(ulong)in_EDI,local_40);
  if (local_10 != (char *)0x0) {
    vasprintf(&local_28,local_10,local_18);
  }
  asprintf(&local_30,"%s: %s\" }",local_20,local_28);
  if (local_28 != (char *)0x0) {
    free(local_28);
    local_28 = (char *)0x0;
  }
  if (local_20 != (char *)0x0) {
    free(local_20);
  }
  return local_30;
}

Assistant:

char *
zt_opt_verror_str(int code, char * fmt, va_list ap) {
    char * msg          = NULL;
    char * user_message = NULL;
    char * final        = NULL;
    int    len          = 0;

    len = asprintf(&msg, "error: { code: %d, string: \"%s", code, code ? strerror(code) : "");
    if (fmt) {
        len += vasprintf(&user_message, fmt, ap);
    }
    len += asprintf(&final, "%s: %s\" }", msg, user_message);

    zt_free(user_message);
    zt_free(msg);
    return final;
}